

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileManager.cpp
# Opt level: O0

void __thiscall FileManager::FileManager(FileManager *this)

{
  anon_union_4_2_94730047 u;
  FileManager *this_local;
  
  std::vector<std::shared_ptr<AssemblerFile>,_std::allocator<std::shared_ptr<AssemblerFile>_>_>::
  vector(&this->files);
  std::shared_ptr<AssemblerFile>::shared_ptr(&this->activeFile);
  this->ownEndianness = Little;
  reset(this);
  return;
}

Assistant:

FileManager::FileManager()
{
	// detect own endianness
	volatile union
	{
		uint32_t i;
		uint8_t c[4];
	} u;
	u.c[3] = 0xAA;
	u.c[2] = 0xBB;
	u.c[1] = 0xCC;
	u.c[0] = 0xDD;

	if (u.i == 0xDDCCBBAA)
		ownEndianness = Endianness::Big;
	else if (u.i == 0xAABBCCDD)
		ownEndianness = Endianness::Little;
	else
		Logger::printError(Logger::Error, "Running on unknown endianness");

	reset();
}